

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsTcpServer.cpp
# Opt level: O2

void __thiscall xs::TcpServer::~TcpServer(TcpServer *this)

{
  Mutex *this_00;
  undefined1 auVar1 [16];
  bool bVar2;
  deSocketState dVar3;
  int __fd;
  ConnectionHandler **in_RSI;
  _Iter in_R8;
  pointer *pppCVar4;
  insert_iterator<std::vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>_>
  __result;
  vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_> allConnections;
  _Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_> local_38;
  
  this->_vptr_TcpServer = (_func_int **)&PTR__TcpServer_0012c960;
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->m_connectionListLock;
  bVar2 = de::Mutex::tryLock(this_00);
  if (bVar2) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = in_R8._M_current;
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<xs::ConnectionHandler**,std::insert_iterator<std::vector<xs::ConnectionHandler*,std::allocator<xs::ConnectionHandler*>>>>
              ((__copy_move<false,false,std::random_access_iterator_tag> *)
               (this->m_liveConnections).
               super__Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (this->m_liveConnections).
               super__Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,(ConnectionHandler **)&local_38,
               (insert_iterator<std::vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>_>
                )(auVar1 << 0x40));
    in_RSI = (this->m_doneConnections).
             super__Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    __result.iter._M_current = in_R8._M_current;
    __result.container =
         (vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_> *)
         local_38._M_impl.super__Vector_impl_data._M_finish;
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<xs::ConnectionHandler**,std::insert_iterator<std::vector<xs::ConnectionHandler*,std::allocator<xs::ConnectionHandler*>>>>
              ((__copy_move<false,false,std::random_access_iterator_tag> *)
               (this->m_doneConnections).
               super__Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>
               ._M_impl.super__Vector_impl_data._M_start,in_RSI,(ConnectionHandler **)&local_38,
               __result);
    de::Mutex::unlock(this_00);
    pppCVar4 = (pointer *)local_38._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    pppCVar4 = (pointer *)0x0;
  }
  for (; __fd = (int)in_RSI, (pointer)pppCVar4 != local_38._M_impl.super__Vector_impl_data._M_finish
      ; pppCVar4 = pppCVar4 + 1) {
    if (*pppCVar4 != (pointer)0x0) {
      (**(code **)((long)**pppCVar4 + 8))();
    }
  }
  dVar3 = de::Socket::getState(&this->m_socket);
  if (dVar3 != DE_SOCKETSTATE_CLOSED) {
    de::Socket::close(&this->m_socket,__fd);
  }
  std::_Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>::
  ~_Vector_base(&local_38);
  std::_Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>::
  ~_Vector_base(&(this->m_doneConnections).
                 super__Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>
               );
  std::_Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>::
  ~_Vector_base(&(this->m_liveConnections).
                 super__Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>
               );
  de::Mutex::~Mutex(this_00);
  de::Socket::~Socket(&this->m_socket);
  return;
}

Assistant:

TcpServer::~TcpServer (void)
{
	try
	{
		std::vector<ConnectionHandler*> allConnections;

		if (m_connectionListLock.tryLock())
		{
			// \note [pyry] It is possible that cleanup actually fails.
			try
			{
				std::copy(m_liveConnections.begin(), m_liveConnections.end(), std::inserter(allConnections, allConnections.end()));
				std::copy(m_doneConnections.begin(), m_doneConnections.end(), std::inserter(allConnections, allConnections.end()));
			}
			catch (...)
			{
			}
			m_connectionListLock.unlock();
		}

		for (std::vector<ConnectionHandler*>::const_iterator i = allConnections.begin(); i != allConnections.end(); i++)
			delete *i;

		if (m_socket.getState() != DE_SOCKETSTATE_CLOSED)
			m_socket.close();
	}
	catch (...)
	{
		// Nada, we're at destructor.
	}
}